

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNodePtr __thiscall punky::par::Parser::parse_if_expression(Parser *this)

{
  bool bVar1;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_68 [8];
  OptIfAltBlk alternative;
  undefined1 local_50 [16];
  Token if_tok;
  
  tok::Token::Token(&if_tok,&in_RSI->m_curr_tok);
  alternative.
  super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
  ._M_payload._0_4_ = 0;
  bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)&alternative);
  if (!bVar1) {
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    goto LAB_0010a79b;
  }
  consume(in_RSI);
  parse_expression((Parser *)(local_50 + 8),(PrecedenceLevel)in_RSI);
  alternative.
  super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
  ._M_payload._0_4_ = 1;
  bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)&alternative);
  if (bVar1) {
    alternative.
    super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
    ._M_payload._0_4_ = 4;
    bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)&alternative);
    if (!bVar1) goto LAB_0010a787;
    parse_block_statement((Parser *)local_50);
    alternative.
    super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
    ._M_engaged = false;
    if ((in_RSI->m_peek_tok).m_type == Else) {
      consume(in_RSI);
      local_68._0_4_ = LeftBrace;
      bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)local_68);
      if (bVar1) {
        parse_block_statement((Parser *)local_68);
        std::
        optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>
        ::operator=((optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>
                     *)&alternative,
                    (unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                     *)local_68);
        if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
        }
        goto LAB_0010a75c;
      }
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    }
    else {
LAB_0010a75c:
      std::
      make_unique<punky::ast::IfExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>,std::optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>>
                ((Token *)local_68,
                 (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
                 &if_tok,(unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                          *)(local_50 + 8),
                 (optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                  *)local_50);
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)CONCAT44(local_68._4_4_,local_68._0_4_);
    }
    std::
    _Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
    ::_M_reset((_Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                *)&alternative);
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  else {
LAB_0010a787:
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
  }
  if ((long *)local_50._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 8))();
  }
LAB_0010a79b:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&if_tok.m_literal);
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_if_expression() -> ast::ExprNodePtr
{
    auto if_tok = m_curr_tok;

    if (!expect_peek_and_consume(TokenType::LeftParen))
        return nullptr;
    consume();

    auto condition = parse_expression(PrecedenceLevel::Lowest);

    if (!expect_peek_and_consume(TokenType::RightParen))
        return nullptr;
    if (!expect_peek_and_consume(TokenType::LeftBrace))
        return nullptr;

    auto consequence = parse_block_statement();

    ast::OptIfAltBlk alternative;
    if (peek_type_is(TokenType::Else))
    {
        consume();
        if (!expect_peek_and_consume(TokenType::LeftBrace))
            return nullptr;

        alternative = parse_block_statement();
    }

    return std::make_unique<ast::IfExpression>(if_tok, std::move(condition),
                                               std::move(consequence), std::move(alternative));
}